

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void game::updateDisplay(Game game)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  undefined1 *puVar4;
  int i;
  long lVar5;
  char local_41;
  undefined1 local_40 [16];
  
  puVar4 = local_40;
  system("clear");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0  1  2 ",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----------",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  lVar5 = 0;
  do {
    lVar3 = -3;
    do {
      local_41 = puVar4[lVar3 + 3];
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_41,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"|  ",3);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"----------",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + 3;
  } while (lVar5 != 3);
  return;
}

Assistant:

void updateDisplay(const Game game) {
        system("clear");
        std::cout << "0  1  2 " << std::endl;
        std::cout << "----------" << std::endl;
        for (int i = 0; i < 3; i++) {
            for (int j = 0; j < 3; j++) {
                std::cout << game.bord[i][j] << "|  ";
            }
            std::cout << i << std::endl << "----------" << std::endl;
        }
    }